

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O2

int Psr_NtkCountObjects(Psr_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  int i;
  
  iVar1 = (pNtk->vObjs).nSize;
  iVar2 = (pNtk->vInputs).nSize + (pNtk->vInouts).nSize + (pNtk->vOutputs).nSize + iVar1;
  for (i = 0; i < iVar1; i = i + 1) {
    Psr_BoxSignals(pNtk,i);
    iVar1 = Psr_BoxIONum(pNtk,i);
    iVar2 = iVar2 + iVar1;
    iVar1 = (pNtk->vObjs).nSize;
  }
  return iVar2;
}

Assistant:

int Psr_NtkCountObjects( Psr_Ntk_t * pNtk )
{
    Vec_Int_t * vFanins; 
    int i, Count = Psr_NtkObjNum(pNtk);
    Psr_NtkForEachBox( pNtk, vFanins, i )
        Count += Psr_BoxIONum(pNtk, i);
    return Count;
}